

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ArgumentParser::ArgumentParser(ArgumentParser *this,string *description_,string *epilog_)

{
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  _func_bool_Group_ptr *in_stack_ffffffffffffff18;
  allocator *paVar1;
  function<bool_(const_args::Group_&)> *in_stack_ffffffffffffff20;
  string *psVar2;
  string *in_stack_ffffffffffffff28;
  Group *in_stack_ffffffffffffff30;
  allocator local_74;
  allocator local_73;
  allocator local_72;
  allocator local_71 [56];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::function<bool(args::Group_const&)>::function<bool(&)(args::Group_const&),void>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Group::Group(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::function<bool_(const_args::Group_&)>::~function
            ((function<bool_(const_args::Group_&)> *)0x148858);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__ArgumentParser_001786c0;
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::string((string *)(in_RDI + 0x11));
  std::__cxx11::string::string((string *)(in_RDI + 0x15),local_10);
  std::__cxx11::string::string((string *)(in_RDI + 0x19),local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x1d),"--",local_71);
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  psVar2 = (string *)(in_RDI + 0x21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(psVar2,"-",&local_72);
  std::allocator<char>::~allocator((allocator<char> *)&local_72);
  psVar2 = (string *)(in_RDI + 0x25);
  paVar1 = &local_73;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(psVar2,"=",paVar1);
  std::allocator<char>::~allocator((allocator<char> *)&local_73);
  paVar1 = &local_74;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x29),"--",paVar1);
  std::allocator<char>::~allocator((allocator<char> *)&local_74);
  *(undefined1 *)(in_RDI + 0x2d) = 1;
  *(undefined1 *)((long)in_RDI + 0x169) = 1;
  *(undefined1 *)((long)in_RDI + 0x16a) = 1;
  *(undefined1 *)((long)in_RDI + 0x16b) = 1;
  HelpParams::HelpParams((HelpParams *)((long)in_RDI + 0x16c));
  return;
}

Assistant:

ArgumentParser(const std::string &description_, const std::string &epilog_ = std::string()) :
                Group("", Group::Validators::AllChildGroups),
                description(description_),
                epilog(epilog_),
                longprefix("--"),
                shortprefix("-"),
                longseparator("="),
                terminator("--"),
                allowJoinedShortValue(true),
                allowJoinedLongValue(true),
                allowSeparateShortValue(true),
                allowSeparateLongValue(true) {}